

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

DynamicType * __thiscall
Js::JavascriptLibrary::GetObjectHeaderInlinedLiteralType
          (JavascriptLibrary *this,uint16 requestedInlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex PVar3;
  PropertyIndex PVar4;
  undefined4 *puVar5;
  DynamicType **ppDVar6;
  uint16 requestedInlineSlotCapacity_local;
  JavascriptLibrary *this_local;
  
  PVar3 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
  if (PVar3 + 0x10 < (uint)requestedInlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1707,
                                "(requestedInlineSlotCapacity <= (Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity() + 16))"
                                ,
                                "requestedInlineSlotCapacity <= MaxPreInitializedObjectHeaderInlinedTypeInlineSlotCount"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar3 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                    (requestedInlineSlotCapacity);
  PVar4 = DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
  ppDVar6 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__
                      ((WriteBarrierPtr *)
                       (this->objectHeaderInlinedTypes +
                       ((ulong)(long)(int)((uint)PVar3 - (uint)PVar4) >> 1)));
  return *ppDVar6;
}

Assistant:

DynamicType * JavascriptLibrary::GetObjectHeaderInlinedLiteralType(uint16 requestedInlineSlotCapacity)
    {
        Assert(requestedInlineSlotCapacity <= MaxPreInitializedObjectHeaderInlinedTypeInlineSlotCount);

        return
            objectHeaderInlinedTypes[
                (
                    DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity) -
                    DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
                    ) / InlineSlotCountIncrement];
    }